

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::MapFieldGenerator
          (MapFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  (this->super_FieldGenerator).options_ = options;
  (this->super_FieldGenerator)._vptr_FieldGenerator = (_func_int **)&PTR__MapFieldGenerator_004278c8
  ;
  this->descriptor_ = descriptor;
  if (options->proto_h == true) {
    bVar2 = IsFieldDependent(descriptor);
  }
  else {
    bVar2 = false;
  }
  this->dependent_field_ = bVar2;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SetMessageVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

MapFieldGenerator::MapFieldGenerator(const FieldDescriptor* descriptor,
                                     const Options& options)
    : FieldGenerator(options),
      descriptor_(descriptor),
      dependent_field_(options.proto_h && IsFieldDependent(descriptor)) {
  SetMessageVariables(descriptor, &variables_, options);
}